

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcOccupant::~IfcOccupant(IfcOccupant *this)

{
  IfcActor *this_00;
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcActor).super_IfcObject + -0x18);
  this_00 = (IfcActor *)(&(this->super_IfcActor).super_IfcObject.field_0x0 + lVar2);
  plVar1 = (long *)(&this->field_0x110 + lVar2);
  plVar1[-0x22] = 0x837348;
  plVar1[2] = 0x837410;
  plVar1[-0x11] = 0x837370;
  plVar1[-0xf] = 0x837398;
  plVar1[-8] = 0x8373c0;
  plVar1[-4] = 0x8373e8;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcActor::~IfcActor(this_00,&PTR_construction_vtable_24__00837428);
  operator_delete(this_00,0x138);
  return;
}

Assistant:

IfcOccupant() : Object("IfcOccupant") {}